

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int btreeMoveto(BtCursor *pCur,void *pKey,i64 nKey,int bias,int *pRes)

{
  int iVar1;
  UnpackedRecord *p;
  
  if (pKey != (void *)0x0) {
    p = sqlite3VdbeAllocUnpackedRecord(pCur->pKeyInfo);
    if (p == (UnpackedRecord *)0x0) {
      iVar1 = 7;
    }
    else {
      sqlite3VdbeRecordUnpack(pCur->pKeyInfo,(int)nKey,pKey,p);
      if (p->nField == 0) {
        iVar1 = 0xb;
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xf8ff,
                    "bf8c1b2b7a5960c282e543b9c293686dccff272512d08865f4600fb58238b4f9");
      }
      else {
        iVar1 = sqlite3BtreeMovetoUnpacked(pCur,p,nKey,bias,pRes);
      }
      sqlite3DbFreeNN(pCur->pKeyInfo->db,p);
    }
    return iVar1;
  }
  iVar1 = sqlite3BtreeMovetoUnpacked(pCur,(UnpackedRecord *)0x0,nKey,bias,pRes);
  return iVar1;
}

Assistant:

static int btreeMoveto(
  BtCursor *pCur,     /* Cursor open on the btree to be searched */
  const void *pKey,   /* Packed key if the btree is an index */
  i64 nKey,           /* Integer key for tables.  Size of pKey for indices */
  int bias,           /* Bias search to the high end */
  int *pRes           /* Write search results here */
){
  int rc;                    /* Status code */
  UnpackedRecord *pIdxKey;   /* Unpacked index key */

  if( pKey ){
    assert( nKey==(i64)(int)nKey );
    pIdxKey = sqlite3VdbeAllocUnpackedRecord(pCur->pKeyInfo);
    if( pIdxKey==0 ) return SQLITE_NOMEM_BKPT;
    sqlite3VdbeRecordUnpack(pCur->pKeyInfo, (int)nKey, pKey, pIdxKey);
    if( pIdxKey->nField==0 ){
      rc = SQLITE_CORRUPT_BKPT;
      goto moveto_done;
    }
  }else{
    pIdxKey = 0;
  }
  rc = sqlite3BtreeMovetoUnpacked(pCur, pIdxKey, nKey, bias, pRes);
moveto_done:
  if( pIdxKey ){
    sqlite3DbFree(pCur->pKeyInfo->db, pIdxKey);
  }
  return rc;
}